

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-desc.c
# Opt level: O0

void monster_desc(char *desc,size_t max,monster *mon,wchar_t mode)

{
  _Bool _Var1;
  char *pcVar2;
  bool local_44;
  _Bool local_42;
  _Bool local_41;
  char *comma_pos;
  char *pcStack_30;
  wchar_t msex;
  char *choice;
  _Bool use_pronoun;
  _Bool seen;
  wchar_t mode_local;
  monster *mon_local;
  size_t max_local;
  char *desc_local;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-desc.c"
                  ,0x6e,"void monster_desc(char *, size_t, const struct monster *, int)");
  }
  local_41 = true;
  if ((mode & 0x80U) == 0) {
    local_42 = false;
    if ((mode & 0x40U) == 0) {
      local_42 = monster_is_visible(mon);
    }
    local_41 = local_42;
  }
  if ((local_41 == false) || (local_44 = true, (mode & 0x20U) == 0)) {
    local_44 = local_41 == false && (mode & 0x10U) != 0;
  }
  if ((local_41 == false) || (local_44)) {
    pcStack_30 = "it";
    comma_pos._4_4_ = 0;
    if (local_44) {
      _Var1 = flag_has_dbg(mon->race->flags,0xb,4,"mon->race->flags","RF_FEMALE");
      if (_Var1) {
        comma_pos._4_4_ = 0x20;
      }
      else {
        _Var1 = flag_has_dbg(mon->race->flags,0xb,3,"mon->race->flags","RF_MALE");
        if (_Var1) {
          comma_pos._4_4_ = 0x10;
        }
      }
    }
    switch(comma_pos._4_4_ + (mode & 7U)) {
    case L'\0':
      pcStack_30 = "it";
      break;
    case L'\x01':
      pcStack_30 = "it";
      break;
    case L'\x02':
      pcStack_30 = "its";
      break;
    case L'\x03':
      pcStack_30 = "itself";
      break;
    case L'\x04':
      pcStack_30 = "something";
      break;
    case L'\x05':
      pcStack_30 = "something";
      break;
    case L'\x06':
      pcStack_30 = "something\'s";
      break;
    case L'\a':
      pcStack_30 = "itself";
      break;
    case L'\x10':
      pcStack_30 = "he";
      break;
    case L'\x11':
      pcStack_30 = "him";
      break;
    case L'\x12':
      pcStack_30 = "his";
      break;
    case L'\x13':
      pcStack_30 = "himself";
      break;
    case L'\x14':
      pcStack_30 = "someone";
      break;
    case L'\x15':
      pcStack_30 = "someone";
      break;
    case L'\x16':
      pcStack_30 = "someone\'s";
      break;
    case L'\x17':
      pcStack_30 = "himself";
      break;
    case L' ':
      pcStack_30 = "she";
      break;
    case L'!':
      pcStack_30 = "her";
      break;
    case L'\"':
      pcStack_30 = "her";
      break;
    case L'#':
      pcStack_30 = "herself";
      break;
    case L'$':
      pcStack_30 = "someone";
      break;
    case L'%':
      pcStack_30 = "someone";
      break;
    case L'&':
      pcStack_30 = "someone\'s";
      break;
    case L'\'':
      pcStack_30 = "herself";
    }
    my_strcpy(desc,pcStack_30,max);
  }
  else if (((mode & 2U) == 0) || ((mode & 1U) == 0)) {
    _Var1 = flag_has_dbg(mon->race->flags,0xb,1,"mon->race->flags","RF_UNIQUE");
    if (_Var1) {
      if (((((mode & 2U) == 0) ||
           (_Var1 = flag_has_dbg(mon->race->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA"), !_Var1)
           ) || (pcVar2 = strchr(mon->race->name,0x2c), pcVar2 == (char *)0x0)) ||
         (0x3ff < (long)pcVar2 - (long)mon->race->name)) {
        my_strcpy(desc,mon->race->name,max);
      }
      else {
        strnfmt(desc,max,"%.*s",(ulong)(uint)((int)pcVar2 - (int)mon->race->name),mon->race->name);
      }
    }
    else {
      if ((mode & 8U) == 0) {
        my_strcpy(desc,"the ",max);
      }
      else {
        _Var1 = is_a_vowel((int)*mon->race->name);
        pcVar2 = "a ";
        if (_Var1) {
          pcVar2 = "an ";
        }
        my_strcpy(desc,pcVar2,max);
      }
      if ((((mode & 2U) == 0) ||
          (_Var1 = flag_has_dbg(mon->race->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA"), !_Var1))
         || ((pcVar2 = strchr(mon->race->name,0x2c), pcVar2 == (char *)0x0 ||
             (0x3ff < (long)pcVar2 - (long)mon->race->name)))) {
        my_strcat(desc,mon->race->name,max);
      }
      else {
        pcVar2 = format("%.*s",(ulong)(uint)((int)pcVar2 - (int)mon->race->name),mon->race->name);
        my_strcat(desc,pcVar2,max);
      }
    }
    if (((mode & 0x200U) != 0) &&
       (_Var1 = flag_has_dbg(mon->race->flags,0xb,6,"mon->race->flags","RF_NAME_COMMA"), _Var1)) {
      my_strcat(desc,",",max);
    }
    if ((mode & 2U) != 0) {
      my_strcat(desc,"\'s",max);
    }
    _Var1 = panel_contains((mon->grid).y,(mon->grid).x);
    if (!_Var1) {
      my_strcat(desc," (offscreen)",max);
    }
  }
  else {
    _Var1 = flag_has_dbg(mon->race->flags,0xb,4,"mon->race->flags","RF_FEMALE");
    if (_Var1) {
      my_strcpy(desc,"herself",max);
    }
    else {
      _Var1 = flag_has_dbg(mon->race->flags,0xb,3,"mon->race->flags","RF_MALE");
      if (_Var1) {
        my_strcpy(desc,"himself",max);
      }
      else {
        my_strcpy(desc,"itself",max);
      }
    }
  }
  if ((mode & 0x100U) != 0) {
    my_strcap(desc);
  }
  return;
}

Assistant:

void monster_desc(char *desc, size_t max, const struct monster *mon, int mode)
{
	assert(mon != NULL);

	/* Can we see it? (forced, or not hidden + visible) */
	bool seen = (mode & MDESC_SHOW) ||
		(!(mode & MDESC_HIDE) && monster_is_visible(mon));

	/* Sexed pronouns (seen and forced, or unseen and allowed) */
	bool use_pronoun = (seen && (mode & MDESC_PRO_VIS)) ||
			(!seen && (mode & MDESC_PRO_HID));

	/* First, try using pronouns, or describing hidden monsters */
	if (!seen || use_pronoun) {
		const char *choice = "it";

		/* an encoding of the monster "sex" */
		int msex = 0x00;

		/* Extract the gender (if applicable) */
		if (use_pronoun) {
			if (rf_has(mon->race->flags, RF_FEMALE)) {
				msex = 0x20;
			} else if (rf_has(mon->race->flags, RF_MALE)) {
				msex = 0x10;
			}
		}

		/* Brute force: split on the possibilities */
		switch (msex + (mode & 0x07)) {
			/* Neuter */
			case 0x00: choice = "it"; break;
			case 0x01: choice = "it"; break;
			case 0x02: choice = "its"; break;
			case 0x03: choice = "itself"; break;
			case 0x04: choice = "something"; break;
			case 0x05: choice = "something"; break;
			case 0x06: choice = "something's"; break;
			case 0x07: choice = "itself"; break;

			/* Male */
			case 0x10: choice = "he"; break;
			case 0x11: choice = "him"; break;
			case 0x12: choice = "his"; break;
			case 0x13: choice = "himself"; break;
			case 0x14: choice = "someone"; break;
			case 0x15: choice = "someone"; break;
			case 0x16: choice = "someone's"; break;
			case 0x17: choice = "himself"; break;

			/* Female */
			case 0x20: choice = "she"; break;
			case 0x21: choice = "her"; break;
			case 0x22: choice = "her"; break;
			case 0x23: choice = "herself"; break;
			case 0x24: choice = "someone"; break;
			case 0x25: choice = "someone"; break;
			case 0x26: choice = "someone's"; break;
			case 0x27: choice = "herself"; break;
		}

		my_strcpy(desc, choice, max);
	} else if ((mode & MDESC_POSS) && (mode & MDESC_OBJE)) {
		/* The monster is visible, so use its gender */
		if (rf_has(mon->race->flags, RF_FEMALE))
			my_strcpy(desc, "herself", max);
		else if (rf_has(mon->race->flags, RF_MALE))
			my_strcpy(desc, "himself", max);
		else
			my_strcpy(desc, "itself", max);
	} else {
		const char *comma_pos;

		/* Unique, indefinite or definite */
		if (rf_has(mon->race->flags, RF_UNIQUE)) {
			/* Start with the name (thus nominative and objective) */
			/*
			 * Strip off descriptive phrase if a possessive will be
			 * added.
			 */
			if ((mode & MDESC_POSS)
					&& rf_has(mon->race->flags, RF_NAME_COMMA)
					&& (comma_pos = strchr(mon->race->name, ','))
					&& comma_pos - mon->race->name < 1024) {
				strnfmt(desc, max, "%.*s",
					(int) (comma_pos - mon->race->name),
					mon->race->name);
			} else {
				my_strcpy(desc, mon->race->name, max);
			}
		} else {
			if (mode & MDESC_IND_VIS) {
				/* XXX Check plurality for "some" */
				/* Indefinite monsters need an indefinite article */
				my_strcpy(desc, is_a_vowel(mon->race->name[0]) ? "an " : "a ", max);
			} else {
				/* Definite monsters need a definite article */
				my_strcpy(desc, "the ", max);
			}

			/*
			 * As with uniques, strip off phrase if a possessive
			 * will be added.
			 */
			if ((mode & MDESC_POSS)
					&& rf_has(mon->race->flags, RF_NAME_COMMA)
					&& (comma_pos = strchr(mon->race->name, ','))
					&& comma_pos - mon->race->name < 1024) {
				my_strcat(desc, format("%.*s",
					(int) (comma_pos - mon->race->name),
					mon->race->name), max);
			} else {
				my_strcat(desc, mon->race->name, max);
			}
		}

		if ((mode & MDESC_COMMA)
				&& rf_has(mon->race->flags, RF_NAME_COMMA)) {
			my_strcat(desc, ",", max);
		}

		/* Handle the possessive */
		/* XXX Check for trailing "s" */
		if (mode & MDESC_POSS) {
			my_strcat(desc, "'s", max);
		}

		/* Mention "offscreen" monsters */
		if (!panel_contains(mon->grid.y, mon->grid.x)) {
			my_strcat(desc, " (offscreen)", max);
		}
	}

	if (mode & MDESC_CAPITAL) {
		my_strcap(desc);
	}
}